

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O0

void CleanUp_ontrak(BOOL bSetDefaultDevicesState)

{
  BOOL bSetDefaultDevicesState_local;
  
  if (bSetDefaultDevicesState != 0) {
    SetDigitalRelayOntrak(&ontrak,7,0);
    SetDigitalRelayOntrak(&ontrak,6,0);
    SetRelayOntrak(&ontrak,3,1);
    SetRelayOntrak(&ontrak,4,0);
    SetRelayOntrak(&ontrak,2,1);
    SetRelayOntrak(&ontrak,1,1);
    SetRelayOntrak(&ontrak,0,1);
  }
  fclose((FILE *)logpowerfile_ontrak);
  StopChrono(&chrono_power,&t_ontrak);
  return;
}

Assistant:

void CleanUp_ontrak(BOOL bSetDefaultDevicesState)
{
	if (bSetDefaultDevicesState)
	{
		SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 0);
		SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 0);
		SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 1); // Active-low.
		SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 0);
		SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 1);
		SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 1);
		SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 1); // Active-low.
	}
	fclose(logpowerfile_ontrak);
	StopChrono(&chrono_power, &t_ontrak);
}